

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall
tetgenmesh::calculateabovepoint4(tetgenmesh *this,point pa,point pb,point pc,point pd)

{
  point pdVar1;
  double *n;
  tetgenmesh *this_00;
  double dVar2;
  double dVar3;
  double n2 [3];
  double n1 [3];
  double local_68;
  double local_60;
  double local_58;
  double local_48;
  double local_40;
  double local_38;
  
  n = &local_48;
  this_00 = this;
  facenormal(this,pa,pb,pc,n,1,(double *)0x0);
  dVar2 = local_38 * local_38 + local_48 * local_48 + local_40 * local_40;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  facenormal(this_00,pa,pb,pd,&local_68,1,(double *)0x0);
  dVar3 = local_58 * local_58 + local_68 * local_68 + local_60 * local_60;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  if (dVar2 <= dVar3) {
    dVar2 = dVar3;
    n = &local_68;
  }
  *n = *n / dVar2;
  n[1] = n[1] / dVar2;
  n[2] = n[2] / dVar2;
  dVar2 = (pb[2] - pa[2]) * (pb[2] - pa[2]) +
          (*pb - *pa) * (*pb - *pa) + (pb[1] - pa[1]) * (pb[1] - pa[1]);
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  pdVar1 = this->dummypoint;
  *pdVar1 = *n * dVar2 + *pa;
  pdVar1[1] = n[1] * dVar2 + pa[1];
  pdVar1[2] = dVar2 * n[2] + pa[2];
  return;
}

Assistant:

void tetgenmesh::calculateabovepoint4(point pa, point pb, point pc, point pd)
{
  REAL n1[3], n2[3], *norm;
  REAL len, len1, len2;

  // Select a base.
  facenormal(pa, pb, pc, n1, 1, NULL);
  len1 = sqrt(dot(n1, n1));
  facenormal(pa, pb, pd, n2, 1, NULL);
  len2 = sqrt(dot(n2, n2));
  if (len1 > len2) {
    norm = n1;
    len = len1;
  } else {
    norm = n2;
    len = len2;
  }
  norm[0] /= len;
  norm[1] /= len;
  norm[2] /= len;
  len = distance(pa, pb);
  dummypoint[0] = pa[0] + len * norm[0];
  dummypoint[1] = pa[1] + len * norm[1];
  dummypoint[2] = pa[2] + len * norm[2];
}